

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# u16.c
# Opt level: O2

size_t u16CLZ_fast(u16 w)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  undefined2 in_register_0000003a;
  
  uVar1 = CONCAT22(in_register_0000003a,w) >> 8;
  if (w < 0x100) {
    uVar1 = CONCAT22(in_register_0000003a,w);
  }
  uVar4 = (ulong)(w < 0x100) * 8;
  uVar5 = uVar4 | 4;
  uVar2 = uVar1 >> 4;
  if ((ushort)uVar1 < 0x10) {
    uVar5 = uVar4 + 8;
    uVar2 = uVar1;
  }
  uVar4 = uVar5 - 2;
  uVar1 = uVar2 >> 2;
  if ((ushort)uVar2 < 4) {
    uVar4 = uVar5;
    uVar1 = uVar2;
  }
  lVar3 = -2;
  if ((ushort)uVar1 < 2) {
    lVar3 = -(ulong)uVar1;
  }
  return lVar3 + uVar4;
}

Assistant:

size_t FAST(u16CLZ)(register u16 w)
{
	register size_t l = 16;
	register u16 t;
	if (t = w >> 8)
		l -= 8, w = t;
	if (t = w >> 4)
		l -= 4, w = t;
	if (t = w >> 2)
		l -= 2, w = t;
	t = 0;
	return (w >> 1) ? l - 2 : l - (w ? 1 : 0);
}